

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O2

UnitySource * __thiscall
cmLocalGenerator::WriteUnitySource
          (UnitySource *__return_storage_ptr__,cmLocalGenerator *this,cmGeneratorTarget *target,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *configs,cmRange<__gnu_cxx::__normal_iterator<const_cmLocalGenerator::UnityBatchedSource_*,_std::vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>_>_>
                   sources,cmValue beforeInclude,cmValue afterInclude,string filename)

{
  pointer puVar1;
  cmSourceFile *this_00;
  bool perConfig;
  Encoding encoding;
  cmValue uniqueIdName;
  cmGlobalGenerator *pcVar2;
  string *psVar3;
  char *pcVar4;
  __normal_iterator<const_cmLocalGenerator::UnityBatchedSource_*,_std::vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>_>
  _Var5;
  pointer puVar6;
  size_t sStackY_3d0;
  undefined1 local_380 [48];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> cond;
  cmAlphaNum local_328;
  string local_2f8;
  string local_2d8;
  string local_2b8;
  cmGeneratedFileStream file;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&file,"UNITY_BUILD_UNIQUE_ID",(allocator<char> *)local_380);
  uniqueIdName = cmGeneratorTarget::GetProperty(target,(string *)&file);
  std::__cxx11::string::~string((string *)&file);
  pcVar2 = cmGeneratorTarget::GetGlobalGenerator(target);
  encoding = (*pcVar2->_vptr_cmGlobalGenerator[5])(pcVar2);
  cmGeneratedFileStream::cmGeneratedFileStream
            (&file,(string *)filename._M_dataplus._M_p,false,encoding);
  cmGeneratedFileStream::SetCopyIfDifferent(&file,true);
  std::operator<<((ostream *)&file,"/* generated by CMake */\n\n");
  perConfig = false;
  for (_Var5 = sources.Begin._M_current; _Var5._M_current != sources.End._M_current._M_current;
      _Var5._M_current = _Var5._M_current + 1) {
    cond.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_engaged = false;
    if ((long)((_Var5._M_current)->Configs).
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)((_Var5._M_current)->Configs).
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start >> 3 !=
        (long)(configs->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish -
        (long)(configs->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start >> 5) {
      local_380._0_8_ = local_380 + 0x10;
      local_380._8_8_ = (pointer)0x0;
      local_380[0x10] = '\0';
      std::optional<std::__cxx11::string>::operator=
                ((optional<std::__cxx11::string> *)&cond,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_380);
      std::__cxx11::string::~string((string *)local_380);
      puVar1 = ((_Var5._M_current)->Configs).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish;
      sStackY_3d0 = 0;
      pcVar4 = (char *)0x0;
      for (puVar6 = ((_Var5._M_current)->Configs).
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start; puVar6 != puVar1; puVar6 = puVar6 + 1) {
        local_380._0_8_ =
             cond.
             super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
             ._M_payload.
             super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
             .
             super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ._M_payload._M_value._M_string_length;
        local_380._8_8_ =
             cond.
             super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
             ._M_payload.
             super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
             .
             super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ._M_payload._M_value._M_dataplus._M_p;
        local_328.View_._M_len = sStackY_3d0;
        local_328.View_._M_str = pcVar4;
        cmsys::SystemTools::UpperCase
                  (&local_2f8,
                   (configs->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start + *puVar6);
        cmStrCat<char[28],std::__cxx11::string,char[2]>
                  (&local_2b8,(cmAlphaNum *)local_380,&local_328,
                   (char (*) [28])"defined(CMAKE_UNITY_CONFIG_",&local_2f8,(char (*) [2])0x67e078);
        std::optional<std::__cxx11::string>::operator=
                  ((optional<std::__cxx11::string> *)&cond,&local_2b8);
        std::__cxx11::string::~string((string *)&local_2b8);
        std::__cxx11::string::~string((string *)&local_2f8);
        sStackY_3d0 = 4;
        pcVar4 = " || ";
      }
      perConfig = true;
    }
    this_00 = (_Var5._M_current)->Source;
    psVar3 = cmSourceFile::ResolveFullPath(this_00,(string *)0x0,(string *)0x0);
    cmGeneratorTarget::AddSourceFileToUnityBatch(target,psVar3);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_380,"UNITY_SOURCE_FILE",(allocator<char> *)&local_328);
    cmSourceFile::SetProperty(this_00,(string *)local_380,(cmValue)filename._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)local_380);
    psVar3 = cmSourceFile::ResolveFullPath((_Var5._M_current)->Source,(string *)0x0,(string *)0x0);
    WriteUnitySourceInclude
              (this,(ostream *)&file,&cond,psVar3,beforeInclude,afterInclude,uniqueIdName);
    std::
    _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&cond);
  }
  std::__cxx11::string::string((string *)&local_2d8,(string *)filename._M_dataplus._M_p);
  UnitySource::UnitySource(__return_storage_ptr__,&local_2d8,perConfig);
  std::__cxx11::string::~string((string *)&local_2d8);
  cmGeneratedFileStream::~cmGeneratedFileStream(&file);
  return __return_storage_ptr__;
}

Assistant:

cmLocalGenerator::UnitySource cmLocalGenerator::WriteUnitySource(
  cmGeneratorTarget* target, std::vector<std::string> const& configs,
  cmRange<std::vector<UnityBatchedSource>::const_iterator> sources,
  cmValue beforeInclude, cmValue afterInclude, std::string filename) const
{
  cmValue uniqueIdName = target->GetProperty("UNITY_BUILD_UNIQUE_ID");
  cmGeneratedFileStream file(
    filename, false, target->GetGlobalGenerator()->GetMakefileEncoding());
  file.SetCopyIfDifferent(true);
  file << "/* generated by CMake */\n\n";

  bool perConfig = false;
  for (UnityBatchedSource const& ubs : sources) {
    cm::optional<std::string> cond;
    if (ubs.Configs.size() != configs.size()) {
      perConfig = true;
      cond = std::string();
      cm::string_view sep;
      for (size_t ci : ubs.Configs) {
        cond = cmStrCat(*cond, sep, "defined(CMAKE_UNITY_CONFIG_",
                        cmSystemTools::UpperCase(configs[ci]), ")");
        sep = " || "_s;
      }
    }
    RegisterUnitySources(target, ubs.Source, filename);
    WriteUnitySourceInclude(file, cond, ubs.Source->ResolveFullPath(),
                            beforeInclude, afterInclude, uniqueIdName);
  }

  return UnitySource(std::move(filename), perConfig);
}